

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O2

long delegation(OperationConfig *config,char *str)

{
  int iVar1;
  long lStack_20;
  
  iVar1 = curl_strequal("none");
  if (iVar1 == 0) {
    iVar1 = curl_strequal("policy",str);
    if (iVar1 == 0) {
      iVar1 = curl_strequal("always",str);
      if (iVar1 == 0) {
        lStack_20 = 0;
        warnf(config->global,"unrecognized delegation method \'%s\', using none\n",str);
      }
      else {
        lStack_20 = 2;
      }
    }
    else {
      lStack_20 = 1;
    }
  }
  else {
    lStack_20 = 0;
  }
  return lStack_20;
}

Assistant:

long delegation(struct OperationConfig *config, const char *str)
{
  if(curl_strequal("none", str))
    return CURLGSSAPI_DELEGATION_NONE;
  if(curl_strequal("policy", str))
    return CURLGSSAPI_DELEGATION_POLICY_FLAG;
  if(curl_strequal("always", str))
    return CURLGSSAPI_DELEGATION_FLAG;

  warnf(config->global, "unrecognized delegation method '%s', using none\n",
        str);

  return CURLGSSAPI_DELEGATION_NONE;
}